

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O1

int uv__signal_register_handler(int signum,int oneshot)

{
  int iVar1;
  int *piVar2;
  undefined1 local_148 [8];
  sigaction sa_old;
  sigaction sa;
  int oneshot_local;
  int signum_local;
  
  sa.sa_restorer._4_4_ = oneshot;
  memset(&sa_old.sa_restorer,0,0x98);
  iVar1 = sigfillset((sigset_t *)&sa);
  if (iVar1 != 0) {
    abort();
  }
  sa_old.sa_restorer = uv__signal_handler;
  sa.sa_mask.__val[0xf]._0_4_ = 0x10000000;
  if (sa.sa_restorer._4_4_ != 0) {
    sa.sa_mask.__val[0xf]._0_4_ = 0x90000000;
  }
  iVar1 = sigaction(signum,(sigaction *)&sa_old.sa_restorer,(sigaction *)local_148);
  if (iVar1 == 0) {
    uv__sigaction_set(signum,(sigaction *)local_148);
    oneshot_local = 0;
  }
  else {
    piVar2 = __errno_location();
    oneshot_local = -*piVar2;
  }
  return oneshot_local;
}

Assistant:

static int uv__signal_register_handler(int signum, int oneshot) {
  /* When this function is called, the signal lock must be held. */
  struct sigaction sa;
  struct sigaction sa_old;

  /* XXX use a separate signal stack? */
  memset(&sa, 0, sizeof(sa));
  if (sigfillset(&sa.sa_mask))
    abort();
  sa.sa_handler = uv__signal_handler;
  sa.sa_flags = SA_RESTART;
  if (oneshot)
    sa.sa_flags |= SA_RESETHAND;

  if (sigaction(signum, &sa, &sa_old))
    return UV__ERR(errno);

  uv__sigaction_set(signum, &sa_old);

  return 0;
}